

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::CanIWriteThisFile(cmMakefile *this,string *fileName)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  string *file2;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_DISABLE_SOURCE_CHANGES",&local_41);
  bVar1 = IsOn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = true;
  if (bVar1) {
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    file2 = GetHomeOutputDirectory_abi_cxx11_(this);
    bVar1 = cmsys::SystemTools::SameFile(psVar3,file2);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"CMAKE_DISABLE_IN_SOURCE_BUILD",&local_41);
      bVar2 = IsOn(this,&local_40);
      bVar2 = !bVar2;
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      bVar1 = cmsys::SystemTools::IsSubDirectory(fileName,psVar3);
      if (bVar1) {
        psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
        bVar1 = cmsys::SystemTools::IsSubDirectory(fileName,psVar3);
        if (!bVar1) {
          psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
          bVar2 = cmsys::SystemTools::SameFile(fileName,psVar3);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmMakefile::CanIWriteThisFile(std::string const& fileName) const
{
  if (!this->IsOn("CMAKE_DISABLE_SOURCE_CHANGES")) {
    return true;
  }
  // If we are doing an in-source build, then the test will always fail
  if (cmSystemTools::SameFile(this->GetHomeDirectory(),
                              this->GetHomeOutputDirectory())) {
    return !this->IsOn("CMAKE_DISABLE_IN_SOURCE_BUILD");
  }

  return !cmSystemTools::IsSubDirectory(fileName, this->GetHomeDirectory()) ||
    cmSystemTools::IsSubDirectory(fileName, this->GetHomeOutputDirectory()) ||
    cmSystemTools::SameFile(fileName, this->GetHomeOutputDirectory());
}